

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O3

int lws_hdr_extant(lws *wsi,lws_token_indexes h)

{
  allocated_headers *paVar1;
  uint uVar2;
  
  paVar1 = (wsi->http).ah;
  uVar2 = 0;
  if ((paVar1 != (allocated_headers *)0x0) && (uVar2 = 0, (ulong)paVar1->frag_index[h] != 0)) {
    uVar2 = paVar1->frags[paVar1->frag_index[h]].flags >> 1 & 1;
  }
  return uVar2;
}

Assistant:

int
lws_hdr_extant(struct lws *wsi, enum lws_token_indexes h)
{
	struct allocated_headers *ah = wsi->http.ah;
	int n;

	if (!ah)
		return 0;

	n = ah->frag_index[h];
	if (!n)
		return 0;

	return !!(ah->frags[n].flags & 2);
}